

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

bool amrex::anon_unknown_12::anon_unknown_0::squeryval<double>
               (Table *table,string *name,double *ptr,int ival,int occurrence)

{
  bool bVar1;
  undefined8 in_RAX;
  PP_entry *pp;
  ostream *poVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  string *str;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pp = ppindex(table,occurrence,name,false);
  if (pp != (PP_entry *)0x0) {
    if ((int)((ulong)((long)(pp->m_vals).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pp->m_vals).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) <= ival) {
      poVar2 = ErrorStream();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"ParmParse::queryval no value number",0x23);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,ival);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," for ",5);
      poVar2 = ErrorStream();
      if (occurrence == -1) {
        pcVar5 = "last occurrence of ";
        lVar4 = 0x13;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," occurrence ",0xc);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,occurrence);
        pcVar5 = " of ";
        lVar4 = 4;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,lVar4);
      poVar2 = ErrorStream();
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(pp->m_name)._M_dataplus._M_p,(pp->m_name)._M_string_length);
      uStack_38._0_4_ = CONCAT13(10,(undefined3)uStack_38);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)((long)&uStack_38 + 3),1);
      amrex::operator<<(poVar2,pp);
      uStack_38._0_5_ = CONCAT14(10,(undefined4)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 4),1);
      Abort_host((char *)0x0);
    }
    str = (pp->m_vals).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + ival;
    bVar1 = is<double>(str,ptr);
    if (!bVar1) {
      poVar2 = ErrorStream();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"ParmParse::queryval type mismatch on value number ",0x32);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,ival);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," of ",4);
      uStack_38._0_6_ = CONCAT15(10,(undefined5)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 5),1);
      poVar2 = ErrorStream();
      if (occurrence == -1) {
        pcVar5 = " last occurrence of ";
        lVar4 = 0x14;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," occurrence number ",0x13);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,occurrence);
        pcVar5 = " of ";
        lVar4 = 4;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,lVar4);
      poVar2 = ErrorStream();
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(pp->m_name)._M_dataplus._M_p,(pp->m_name)._M_string_length);
      uStack_38._0_7_ = CONCAT16(10,(undefined6)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 6),1);
      poVar2 = ErrorStream();
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," Expected an \"",0xe);
      pcVar5 = _rfind + (*_rfind == '*');
      sVar3 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"\" type  which can\'t be parsed from the string \"",0x2f);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(str->_M_dataplus)._M_p,str->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
      amrex::operator<<(poVar2,pp);
      uStack_38 = CONCAT17(10,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 7),1);
      Abort_host((char *)0x0);
    }
  }
  return pp != (PP_entry *)0x0;
}

Assistant:

bool
squeryval (const ParmParse::Table& table,
           const std::string& name,
           T&           ptr,
           int          ival,
           int          occurrence)
{
    //
    // Get last occurrence of name in table.
    //
    const ParmParse::PP_entry* def = ppindex(table, occurrence, name, false);
    if ( def == 0 )
    {
        return false;
    }
    //
    // Does it have ival values?
    //
    if ( ival >= static_cast<int>(def->m_vals.size()) )
    {
        amrex::ErrorStream() << "ParmParse::queryval no value number"
                  << ival << " for ";
        if ( occurrence ==  ParmParse::LAST )
        {
            amrex::ErrorStream() << "last occurrence of ";
        }
        else
        {
            amrex::ErrorStream() << " occurrence " << occurrence << " of ";
        }
        amrex::ErrorStream() << def->m_name << '\n' << *def << '\n';
        amrex::Abort();
    }

    const std::string& valname = def->m_vals[ival];

    bool ok = is(valname, ptr);
    if ( !ok )
    {
        amrex::ErrorStream() << "ParmParse::queryval type mismatch on value number "
                  << ival << " of " << '\n';
        if ( occurrence == ParmParse::LAST )
        {
            amrex::ErrorStream() << " last occurrence of ";
        }
        else
        {
            amrex::ErrorStream() << " occurrence number " << occurrence << " of ";
        }
        amrex::ErrorStream() << def->m_name << '\n';
        amrex::ErrorStream() << " Expected an \""
                  << tok_name(ptr)
                  << "\" type  which can't be parsed from the string \""
                  << valname << "\"\n"
                  << *def << '\n';
        amrex::Abort();
    }
    return true;
}